

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispLexer.cpp
# Opt level: O0

void __thiscall Shell::LispLexer::skipWhiteSpacesAndComments(LispLexer *this)

{
  int iVar1;
  bool bVar2;
  long in_RDI;
  bool comment;
  Lexer *in_stack_ffffffffffffffd8;
  
  bVar2 = false;
LAB_00bcb9f8:
  do {
    while( true ) {
      if (((*(byte *)(in_RDI + 0x38) ^ 0xff) & 1) == 0) {
        return;
      }
      iVar1 = *(int *)(in_RDI + 8);
      if (iVar1 != 9) break;
LAB_00bcba4d:
      Lexer::readNextChar(in_stack_ffffffffffffffd8);
    }
    if (iVar1 != 10) {
      if ((iVar1 - 0xcU < 2) || (iVar1 == 0x20)) goto LAB_00bcba4d;
      if (iVar1 == 0x3b) {
        bVar2 = true;
        Lexer::readNextChar(in_stack_ffffffffffffffd8);
      }
      else {
        if (!bVar2) {
          return;
        }
        Lexer::readNextChar(in_stack_ffffffffffffffd8);
      }
      goto LAB_00bcb9f8;
    }
    bVar2 = false;
    Lexer::readNextChar(in_stack_ffffffffffffffd8);
  } while( true );
}

Assistant:

void LispLexer::skipWhiteSpacesAndComments ()
{
  bool comment = false;
  while (! _eof) {
    switch (_lastCharacter) {
    case ' ':
    case '\t':
    case '\r':
    case '\f':
      readNextChar();
      break;

    case '\n': // end-of-line comment (if any) finished
      comment = false;
      readNextChar();
      break;

    case ';': // Lisp comment sign
      comment = true;
      readNextChar();
      break;

    default:
      if (comment) {
	readNextChar();
	break;
      }
      return;
    }
  }
}